

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

bool __thiscall
CLIntercept::overrideGetPlatformInfo
          (CLIntercept *this,cl_platform_id platform,cl_platform_info param_name,
          size_t param_value_size,void *param_value,size_t *param_value_size_ret,cl_int *errorCode)

{
  size_type sVar1;
  cl_int cVar2;
  uint uVar3;
  char *pcVar4;
  size_t __n;
  char *ptr;
  size_t minor;
  char *platformExtensions;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  uVar3 = 0;
  switch(param_name) {
  case 0x900:
    sVar1 = (this->m_Config).PlatformProfile._M_string_length;
    uVar3 = 0;
    if (sVar1 == 0) goto switchD_00187c19_caseD_904;
    __n = sVar1 + 1;
    if ((param_value != (void *)0x0) && (uVar3 = 0xffffffe2, __n <= param_value_size)) {
      pcVar4 = (this->m_Config).PlatformProfile._M_dataplus._M_p;
LAB_00187d7b:
      strncpy((char *)param_value,pcVar4,__n);
      uVar3 = 0;
    }
    break;
  case 0x901:
    sVar1 = (this->m_Config).PlatformVersion._M_string_length;
    uVar3 = 0;
    if (sVar1 == 0) goto switchD_00187c19_caseD_904;
    __n = sVar1 + 1;
    if ((param_value != (void *)0x0) && (uVar3 = 0xffffffe2, __n <= param_value_size)) {
      pcVar4 = (this->m_Config).PlatformVersion._M_dataplus._M_p;
      goto LAB_00187d7b;
    }
    break;
  case 0x902:
    sVar1 = (this->m_Config).PlatformName._M_string_length;
    uVar3 = 0;
    if (sVar1 == 0) goto switchD_00187c19_caseD_904;
    __n = sVar1 + 1;
    if ((param_value != (void *)0x0) && (uVar3 = 0xffffffe2, __n <= param_value_size)) {
      pcVar4 = (this->m_Config).PlatformName._M_dataplus._M_p;
      goto LAB_00187d7b;
    }
    break;
  case 0x903:
    sVar1 = (this->m_Config).PlatformVendor._M_string_length;
    uVar3 = 0;
    if (sVar1 == 0) goto switchD_00187c19_caseD_904;
    __n = sVar1 + 1;
    uVar3 = 0;
    if ((param_value != (void *)0x0) && (uVar3 = 0xffffffe2, __n <= param_value_size)) {
      pcVar4 = (this->m_Config).PlatformVendor._M_dataplus._M_p;
      goto LAB_00187d7b;
    }
    break;
  case 0x904:
  case 0x905:
    goto switchD_00187c19_caseD_904;
  case 0x906:
    if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
      local_38 = (char *)0x0;
      cVar2 = allocateAndGetPlatformInfoString(this,platform,0x901,&local_38);
      pcVar4 = local_38;
      *errorCode = cVar2;
      uVar3 = (uint)(local_38 != (char *)0x0 && cVar2 == 0);
      if (local_38 != (char *)0x0 && cVar2 == 0) {
        cVar2 = 0;
        local_40 = 0;
        local_48 = 0;
        getMajorMinorVersionFromString(this,"OpenCL ",local_38,&local_40,&local_48);
        if ((param_value != (void *)0x0) && (cVar2 = -0x1e, 3 < param_value_size)) {
          *(uint *)param_value = ((uint)local_48 & 0x3ff) << 0xc | (int)local_40 << 0x16;
          cVar2 = 0;
        }
        if (param_value_size_ret != (size_t *)0x0) {
          *param_value_size_ret = 4;
        }
        *errorCode = cVar2;
      }
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
      }
      goto switchD_00187c19_caseD_904;
    }
LAB_00187e4f:
    uVar3 = 0;
    goto switchD_00187c19_caseD_904;
  case 0x907:
    if ((this->m_Config).Emulate_cl_khr_extended_versioning != true) goto LAB_00187e4f;
    local_38 = (char *)0x0;
    allocateAndGetPlatformInfoString(this,platform,0x904,&local_38);
    pcVar4 = local_38;
    cVar2 = parseExtensionString
                      (local_38,(cl_name_version_khr *)param_value,param_value_size,
                       param_value_size_ret);
    *errorCode = cVar2;
    if (pcVar4 != (char *)0x0) {
      operator_delete__(pcVar4);
    }
    goto LAB_00187d94;
  default:
    uVar3 = 0;
    if (param_name != 0x2036) goto switchD_00187c19_caseD_904;
    uVar3 = 0;
    if ((this->m_Config).Emulate_cl_khr_semaphore != true) goto switchD_00187c19_caseD_904;
    uVar3 = 0;
    if ((param_value != (void *)0x0) && (uVar3 = 0xffffffe2, 3 < param_value_size)) {
      *(undefined4 *)param_value = 1;
      uVar3 = 0;
    }
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = 4;
    }
    goto LAB_00187d90;
  }
  if (param_value_size_ret != (size_t *)0x0) {
    *param_value_size_ret = __n;
  }
LAB_00187d90:
  *errorCode = uVar3;
LAB_00187d94:
  uVar3 = 1;
switchD_00187c19_caseD_904:
  return SUB41(uVar3,0);
}

Assistant:

bool CLIntercept::overrideGetPlatformInfo(
    cl_platform_id platform,
    cl_platform_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret,
    cl_int& errorCode ) const
{
    bool    override = false;

    switch( param_name )
    {
    case CL_PLATFORM_NAME:
        if( !m_Config.PlatformName.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformName,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_VENDOR:
        if( !m_Config.PlatformVendor.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformVendor,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_PROFILE:
        if( !m_Config.PlatformProfile.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformProfile,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_VERSION:
        if( !m_Config.PlatformVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   platformVersion = NULL;

            errorCode = allocateAndGetPlatformInfoString(
                platform,
                CL_PLATFORM_VERSION,
                platformVersion );
            if( errorCode == CL_SUCCESS && platformVersion )
            {
                // According to the spec, the device version string should have the form:
                //   OpenCL <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL ",
                        platformVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] platformVersion;
            platformVersion = NULL;
        }
        break;
    case CL_PLATFORM_EXTENSIONS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   platformExtensions = NULL;

            allocateAndGetPlatformInfoString(
                platform,
                CL_PLATFORM_EXTENSIONS,
                platformExtensions );

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero extensions are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseExtensionString(
                platformExtensions,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] platformExtensions;
            platformExtensions = NULL;
        }
        break;
    case CL_PLATFORM_SEMAPHORE_TYPES_KHR:
        if( m_Config.Emulate_cl_khr_semaphore )
        {
            // If we decide to emulate multiple semaphore types we will need
            // to return an array, but for now we can return just the binary
            // semaphore type.
            auto    ptr = (cl_semaphore_type_khr*)param_value;
            cl_semaphore_type_khr type = CL_SEMAPHORE_TYPE_BINARY_KHR;
            errorCode = writeParamToMemory(
                param_value_size,
                type,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    default:
        break;
    }

    return override;
}